

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

unique_ptr<XMLNode,_std::default_delete<XMLNode>_> __thiscall XMLParser::parse_node(XMLParser *this)

{
  bool bVar1;
  char *pcVar2;
  XMLParser *in_RSI;
  StringView name;
  StringView local_48;
  Parser local_38;
  
  local_48 = parse_start_tag(in_RSI);
  pcVar2 = (char *)operator_new(0x58);
  *(char **)pcVar2 = local_48.s;
  *(size_t *)(pcVar2 + 8) = local_48.size;
  pcVar2[0x18] = '\0';
  pcVar2[0x19] = '\0';
  pcVar2[0x1a] = '\0';
  pcVar2[0x1b] = '\0';
  pcVar2[0x20] = '\0';
  pcVar2[0x21] = '\0';
  pcVar2[0x22] = '\0';
  pcVar2[0x23] = '\0';
  pcVar2[0x24] = '\0';
  pcVar2[0x25] = '\0';
  pcVar2[0x26] = '\0';
  pcVar2[0x27] = '\0';
  *(char **)(pcVar2 + 0x28) = pcVar2 + 0x18;
  *(char **)(pcVar2 + 0x30) = pcVar2 + 0x18;
  pcVar2[0x48] = '\0';
  pcVar2[0x49] = '\0';
  pcVar2[0x4a] = '\0';
  pcVar2[0x4b] = '\0';
  pcVar2[0x4c] = '\0';
  pcVar2[0x4d] = '\0';
  pcVar2[0x4e] = '\0';
  pcVar2[0x4f] = '\0';
  pcVar2[0x50] = '\0';
  pcVar2[0x51] = '\0';
  pcVar2[0x52] = '\0';
  pcVar2[0x53] = '\0';
  pcVar2[0x54] = '\0';
  pcVar2[0x55] = '\0';
  pcVar2[0x56] = '\0';
  pcVar2[0x57] = '\0';
  pcVar2[0x38] = '\0';
  pcVar2[0x39] = '\0';
  pcVar2[0x3a] = '\0';
  pcVar2[0x3b] = '\0';
  pcVar2[0x3c] = '\0';
  pcVar2[0x3d] = '\0';
  pcVar2[0x3e] = '\0';
  pcVar2[0x3f] = '\0';
  pcVar2[0x40] = '\0';
  pcVar2[0x41] = '\0';
  pcVar2[0x42] = '\0';
  pcVar2[0x43] = '\0';
  pcVar2[0x44] = '\0';
  pcVar2[0x45] = '\0';
  pcVar2[0x46] = '\0';
  pcVar2[0x47] = '\0';
  (this->super_Parser).s.s = pcVar2;
  parse_attributes(in_RSI,(unique_ptr<XMLNode,_std::default_delete<XMLNode>_> *)this);
  while( true ) {
    bVar1 = next_is_end_tag(in_RSI);
    if (bVar1) break;
    local_38.s.s = (in_RSI->super_Parser).s.s;
    local_38.s.size = (in_RSI->super_Parser).s.size;
    bVar1 = Parser::parse(&local_38,"<!--");
    if (bVar1) {
      parse_comment(in_RSI);
    }
    else if (((in_RSI->super_Parser).s.size == 0) || (*(in_RSI->super_Parser).s.s != '<')) {
      parse_char_data(in_RSI);
    }
    else {
      pcVar2 = (this->super_Parser).s.s;
      parse_node((XMLParser *)&local_38);
      std::
      vector<std::unique_ptr<XMLNode,std::default_delete<XMLNode>>,std::allocator<std::unique_ptr<XMLNode,std::default_delete<XMLNode>>>>
      ::emplace_back<std::unique_ptr<XMLNode,std::default_delete<XMLNode>>>
                ((vector<std::unique_ptr<XMLNode,std::default_delete<XMLNode>>,std::allocator<std::unique_ptr<XMLNode,std::default_delete<XMLNode>>>>
                  *)(pcVar2 + 0x40),(unique_ptr<XMLNode,_std::default_delete<XMLNode>_> *)&local_38)
      ;
      std::unique_ptr<XMLNode,_std::default_delete<XMLNode>_>::~unique_ptr
                ((unique_ptr<XMLNode,_std::default_delete<XMLNode>_> *)&local_38);
    }
  }
  parse_end_tag(in_RSI,&local_48);
  return (__uniq_ptr_data<XMLNode,_std::default_delete<XMLNode>,_true,_true>)
         (__uniq_ptr_data<XMLNode,_std::default_delete<XMLNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<XMLNode> parse_node() {
		StringView name = parse_start_tag();
		std::unique_ptr<XMLNode> node(new XMLNode(name));
		parse_attributes(node);
		while (!next_is_end_tag()) {
			if (next_is_comment()) parse_comment();
			else if (next_is_start_tag()) node->add_child(parse_node());
			else parse_char_data();
		}
		parse_end_tag(name);
		return node;
	}